

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# part_attr.c
# Opt level: O3

exr_result_t
exr_attr_set_channels(exr_context_t ctxt,int part_index,char *name,exr_attr_chlist_t *channels)

{
  pthread_mutex_t *__mutex;
  uint nchans;
  exr_priv_part_t p_Var1;
  exr_attr_chlist_entry_t *peVar2;
  exr_attr_chlist_t *peVar3;
  int iVar4;
  exr_result_t eVar5;
  exr_context_t nonc;
  exr_attribute_list_t *list;
  long lVar6;
  exr_attribute_t *attr;
  exr_attr_chlist_t clist;
  
  attr = (exr_attribute_t *)0x0;
  if (ctxt == (exr_context_t)0x0) {
    eVar5 = 2;
  }
  else {
    __mutex = &ctxt->mutex;
    pthread_mutex_lock((pthread_mutex_t *)__mutex);
    if ((part_index < 0) || (ctxt->num_parts <= part_index)) {
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      eVar5 = (*ctxt->print_error)
                        (ctxt,4,"Part index (%d) out of range",(ulong)(uint)part_index,
                         ctxt->print_error);
      return eVar5;
    }
    p_Var1 = ctxt->parts[(uint)part_index];
    if (name != (char *)0x0) {
      iVar4 = strcmp(name,"channels");
      if (iVar4 == 0) {
        pthread_mutex_unlock((pthread_mutex_t *)__mutex);
        eVar5 = exr_set_channels(ctxt,part_index,channels);
        return eVar5;
      }
    }
    if ((ctxt->mode != '\x01') && (ctxt->mode != '\x04')) {
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      eVar5 = (*ctxt->standard_error)(ctxt,8);
      return eVar5;
    }
    if (channels == (exr_attr_chlist_t *)0x0) {
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      eVar5 = (*ctxt->print_error)
                        (ctxt,3,"No input values for setting \'%s\', type \'chlist\'",name,
                         ctxt->print_error);
      return eVar5;
    }
    list = &p_Var1->attributes;
    eVar5 = exr_attr_list_find_by_name(ctxt,list,name,&attr);
    if (eVar5 == 0xf) {
      eVar5 = exr_attr_list_add(ctxt,list,name,EXR_ATTR_CHLIST,0,(uint8_t **)0x0,&attr);
    }
    if (eVar5 == 0) {
      nchans = channels->num_channels;
      eVar5 = exr_attr_chlist_init(ctxt,&clist,nchans);
      if (eVar5 == 0) {
        if (0 < (int)nchans) {
          lVar6 = 0;
          do {
            peVar2 = channels->entries;
            eVar5 = exr_attr_chlist_add_with_length
                              (ctxt,&clist,*(char **)(peVar2->reserved + lVar6 + -0xd),
                               *(int32_t *)(peVar2->reserved + lVar6 + -0x15),
                               *(exr_pixel_type_t *)(peVar2->reserved + lVar6 + -5),
                               (uint)peVar2->reserved[lVar6 + -1],
                               *(int32_t *)(peVar2->reserved + lVar6 + 3),
                               *(int32_t *)(peVar2->reserved + lVar6 + 7));
            if (eVar5 != 0) {
              exr_attr_chlist_destroy(ctxt,&clist);
              goto LAB_0011f0ec;
            }
            lVar6 = lVar6 + 0x20;
          } while ((ulong)nchans << 5 != lVar6);
        }
        exr_attr_chlist_destroy(ctxt,(attr->field_6).chlist);
        peVar3 = (attr->field_6).chlist;
        peVar3->num_channels = clist.num_channels;
        peVar3->num_alloced = clist.num_alloced;
        peVar3->entries = clist.entries;
        eVar5 = 0;
      }
    }
LAB_0011f0ec:
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  }
  return eVar5;
}

Assistant:

exr_result_t
exr_attr_set_channels (
    exr_context_t            ctxt,
    int                      part_index,
    const char*              name,
    const exr_attr_chlist_t* channels)
{
    exr_attribute_t* attr = NULL;
    exr_result_t     rv   = EXR_ERR_SUCCESS;

    EXR_LOCK_AND_DEFINE_PART (part_index);

    if (name && 0 == strcmp (name, EXR_REQ_CHANNELS_STR))
        return EXR_UNLOCK_AND_RETURN (
            exr_set_channels (ctxt, part_index, channels));

    /* do not support updating channels during update operation... */
    if (ctxt->mode != EXR_CONTEXT_WRITE && ctxt->mode != EXR_CONTEXT_TEMPORARY)
        return EXR_UNLOCK_AND_RETURN (
            ctxt->standard_error (ctxt, EXR_ERR_NOT_OPEN_WRITE));

    if (!channels)
        return EXR_UNLOCK_AND_RETURN (ctxt->print_error (
            ctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "No input values for setting '%s', type 'chlist'",
            name));

    rv = exr_attr_list_find_by_name (
        ctxt, (exr_attribute_list_t*) &(part->attributes), name, &attr);

    if (rv == EXR_ERR_NO_ATTR_BY_NAME)
    {
        rv = exr_attr_list_add (
            ctxt, &(part->attributes), name, EXR_ATTR_CHLIST, 0, NULL, &(attr));
    }

    if (rv == EXR_ERR_SUCCESS)
    {
        exr_attr_chlist_t clist;
        int               numchans;

        if (!channels)
            return EXR_UNLOCK_AND_RETURN (ctxt->report_error (
                ctxt,
                EXR_ERR_INVALID_ARGUMENT,
                "No channels provided for channel list"));

        numchans = channels->num_channels;
        rv       = exr_attr_chlist_init (ctxt, &clist, numchans);
        if (rv != EXR_ERR_SUCCESS) return EXR_UNLOCK_AND_RETURN (rv);

        for (int c = 0; c < numchans; ++c)
        {
            const exr_attr_chlist_entry_t* cur = channels->entries + c;

            rv = exr_attr_chlist_add_with_length (
                ctxt,
                &clist,
                cur->name.str,
                cur->name.length,
                cur->pixel_type,
                cur->p_linear,
                cur->x_sampling,
                cur->y_sampling);
            if (rv != EXR_ERR_SUCCESS)
            {
                exr_attr_chlist_destroy (ctxt, &clist);
                return EXR_UNLOCK_AND_RETURN (rv);
            }
        }

        exr_attr_chlist_destroy (ctxt, attr->chlist);
        *(attr->chlist) = clist;
    }
    return EXR_UNLOCK_AND_RETURN (rv);
}